

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

ReferenceType __thiscall
cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*(iterator *this)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  pointer pSVar2;
  ulong uVar3;
  uint __line;
  ulong uVar4;
  char *__assertion;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
    __assertion = "this->Tree";
    __line = 0x56;
  }
  else {
    uVar4 = (long)(pcVar1->UpPositions).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pcVar1->UpPositions).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    pSVar2 = (pcVar1->Data).
             super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar4 == ((long)(pcVar1->Data).
                        super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0xc0) {
      uVar3 = this->Position;
      if (uVar4 < uVar3) {
        __assertion = "this->Position <= this->Tree->Data.size()";
        __line = 0x58;
      }
      else {
        if (uVar3 != 0) {
          return pSVar2 + uVar3 + 0xffffffffffffffff;
        }
        __assertion = "this->Position > 0";
        __line = 0x59;
      }
    }
    else {
      __assertion = "this->Tree->UpPositions.size() == this->Tree->Data.size()";
      __line = 0x57;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,__line,
                "ReferenceType cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*() const [T = cmStateDetail::SnapshotDataType]"
               );
}

Assistant:

ReferenceType operator*() const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      return this->Tree->GetReference(this->Position - 1);
    }